

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdUnopZero<unsigned_int,double>
          (Thread *this,UnopFunc<unsigned_int,_double> *f)

{
  uint uVar1;
  u8 i;
  long lVar2;
  Value value;
  SR result;
  Simd<double,_(unsigned_char)__x02_> val;
  ulong local_38 [2];
  anon_union_16_6_113bff37_for_Value_0 local_28;
  
  local_28.v128_.v = (v128)Pop(this);
  lVar2 = 0;
  do {
    uVar1 = (*f)(*(double *)((long)&local_28 + lVar2 * 8));
    *(uint *)((long)local_38 + lVar2 * 4) = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_38[1] = 0;
  value.field_0._8_8_ = 0;
  value.field_0.i64_ = local_38[0];
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnopZero(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  for (u8 i = 0; i < ST::lanes; ++i) {
    result[i] = f(val[i]);
  }
  for (u8 i = ST::lanes; i < SR::lanes; ++i) {
    result[i] = 0;
  }
  Push(result);
  return RunResult::Ok;
}